

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O0

tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
anon_unknown.dwarf_557d0::substituteEnvironmentVariable
          (tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [32];
  string local_168 [32];
  string local_148 [8];
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  bool local_81;
  char *local_80;
  char *envVariableValue;
  string envVariableName;
  tuple<bool,_const_char_*> local_50;
  ulong local_40;
  size_type endIndex;
  tuple<bool,_const_char_*> local_30;
  long local_20;
  size_type index;
  string *value_local;
  
  index = (size_type)value;
  value_local = (string *)__return_storage_ptr__;
  local_20 = std::__cxx11::string::find((char *)value,0x2b9d3d);
  if (local_20 == -1) {
    endIndex._7_1_ = 1;
    std::make_tuple<bool,char_const(&)[1]>((bool *)&local_30,(char (*) [1])((long)&endIndex + 7));
    std::
    tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    tuple<bool,_const_char_*,_true>(__return_storage_ptr__,&local_30);
  }
  else {
    local_20 = local_20 + 2;
    local_40 = std::__cxx11::string::find((char *)index,0x2b9d1f);
    if (local_20 == -1) {
      envVariableName.field_2._M_local_buf[0xf] = '\0';
      std::make_tuple<bool,char_const(&)[31]>
                ((bool *)&local_50,(char (*) [31])((long)&envVariableName.field_2 + 0xf));
      std::
      tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::tuple<bool,_const_char_*,_true>(__return_storage_ptr__,&local_50);
    }
    else {
      std::__cxx11::string::substr((ulong)&envVariableValue,index);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      local_80 = getenv(pcVar2);
      if (local_80 == (char *)0x0) {
        local_81 = false;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Unable to find environment variable \'",&local_e9);
        std::operator+(&local_c8,&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &envVariableValue);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"\'",(allocator<char> *)(temp.field_2._M_local_buf + 0xf));
        std::operator+(&local_a8,&local_c8,&local_120);
        std::make_tuple<bool,std::__cxx11::string>(__return_storage_ptr__,&local_81,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)(temp.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        temp.field_2._8_4_ = 1;
      }
      else {
        std::__cxx11::string::string(local_148,(string *)index);
        std::__cxx11::string::substr((ulong)local_168,(ulong)local_148);
        std::__cxx11::string::operator=((string *)index,local_168);
        std::__cxx11::string::~string(local_168);
        pcVar2 = local_80;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_188,pcVar2,&local_189);
        std::__cxx11::string::operator+=((string *)index,local_188);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator(&local_189);
        uVar1 = local_40;
        lVar3 = std::__cxx11::string::length();
        if (uVar1 < lVar3 - 1U) {
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_1b0,(ulong)local_148);
          std::__cxx11::string::operator+=((string *)index,local_1b0);
          std::__cxx11::string::~string(local_1b0);
        }
        substituteEnvironmentVariable(__return_storage_ptr__,(string *)index);
        temp.field_2._8_4_ = 1;
        std::__cxx11::string::~string(local_148);
      }
      std::__cxx11::string::~string((string *)&envVariableValue);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, std::string> substituteEnvironmentVariable(std::string& value)
{
    auto index = value.find("${");
    if (index == std::string::npos)
        return std::make_tuple(true, "");
    index += 2; // advance past the "${".
    auto endIndex = value.find("}", index);
    if (index == std::string::npos)
        return std::make_tuple(false, "failed to find } to go with ${");
    std::string envVariableName = value.substr(index, endIndex - index);
    const char* envVariableValue = getenv(envVariableName.c_str());
    if (envVariableValue == nullptr)
        return std::make_tuple(false, std::string("Unable to find environment variable '") + envVariableName + std::string("'"));

    std::string temp(value);
    value = temp.substr(0, index - 2); // up until the starting ${
    value += std::string(envVariableValue);
    if (endIndex < (temp.length()-1))
        value += temp.substr(endIndex + 1, temp.length() - endIndex - 1);
    return substituteEnvironmentVariable(value);
}